

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupSetPointerPluginTest::~TEST_GROUP_CppUTestGroupSetPointerPluginTest
          (TEST_GROUP_CppUTestGroupSetPointerPluginTest *this)

{
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_GROUP(SetPointerPluginTest)
{
    SetPointerPlugin* plugin_;
    TestRegistry* myRegistry_;
    StringBufferTestOutput* output_;
    TestResult* result_;

    void setup() _override
    {
        myRegistry_ = new TestRegistry();
        plugin_ = new SetPointerPlugin("TestSetPlugin");
        myRegistry_->setCurrentRegistry(myRegistry_);
        myRegistry_->installPlugin(plugin_);
        output_ = new StringBufferTestOutput();
        result_ = new TestResult(*output_);
    }

    void teardown() _override
    {
        myRegistry_->setCurrentRegistry(NULLPTR);
        delete myRegistry_;
        delete plugin_;
        delete output_;
        delete result_;
    }
}